

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commands.hpp
# Opt level: O0

bool __thiscall diy::Master::Command<void>::skip(Command<void> *this,int i,Master *m)

{
  bool bVar1;
  undefined4 in_ESI;
  undefined8 in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  bVar1 = std::function<bool_(int,_const_diy::Master_&)>::operator()
                    ((function<bool_(int,_const_diy::Master_&)> *)m,(int)((ulong)in_RDI >> 0x20),
                     (Master *)CONCAT44(in_ESI,in_stack_fffffffffffffff0));
  return bVar1;
}

Assistant:

bool  skip(int i, const Master& m) const override                             { return s(i,m); }